

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cc
# Opt level: O2

void __thiscall tt::net::Channel::~Channel(Channel *this)

{
  std::_Function_base::~_Function_base(&(this->m_connHandler).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_errorHandler).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_writeHandler).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_readHandler).super__Function_base);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->m_holder).super___weak_ptr<tt::net::HttpData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

Channel::~Channel(){}